

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltc_constraints_calculator.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> * __thiscall
ltc_constraints_calculator::calculate_constraints
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,
          ltc_constraints_calculator *this,vector<float,_std::allocator<float>_> *parameters)

{
  float fVar1;
  size_type sVar2;
  ostream *poVar3;
  logic_error *this_00;
  const_reference pvVar4;
  reference pvVar5;
  int local_3c;
  int i;
  float parameter_min_value;
  allocator<float> local_22;
  undefined1 local_21;
  vector<float,_std::allocator<float>_> *local_20;
  vector<float,_std::allocator<float>_> *parameters_local;
  ltc_constraints_calculator *this_local;
  vector<float,_std::allocator<float>_> *constraints;
  
  local_21 = 0;
  local_20 = parameters;
  parameters_local = (vector<float,_std::allocator<float>_> *)this;
  this_local = (ltc_constraints_calculator *)__return_storage_ptr__;
  std::allocator<float>::allocator(&local_22);
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,2,&local_22);
  std::allocator<float>::~allocator(&local_22);
  sVar2 = std::vector<float,_std::allocator<float>_>::size(local_20);
  if (sVar2 == 3) {
    for (local_3c = 0; local_3c < 2; local_3c = local_3c + 1) {
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](local_20,(long)local_3c);
      fVar1 = *pvVar4;
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         (__return_storage_ptr__,(long)local_3c);
      *pvVar5 = 1e-06 - fVar1;
    }
    return __return_storage_ptr__;
  }
  poVar3 = log_error();
  poVar3 = std::operator<<(poVar3,"Expected 3 parameters in ltc_constraints_calculator, received ");
  sVar2 = std::vector<float,_std::allocator<float>_>::size(local_20);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar2);
  poVar3 = std::operator<<(poVar3,".");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Expected 3 parameters.");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

std::vector<float> ltc_constraints_calculator::calculate_constraints(const std::vector<float> &parameters)
{
  auto constraints = std::vector<float>(2);
  // constraints g(x) <= 0

  if (parameters.size() != 3)
  {
    log_error() << "Expected 3 parameters in ltc_constraints_calculator, received " << parameters.size() << "."
      << std::endl;

    throw std::logic_error("Expected 3 parameters.");
  }

  float parameter_min_value = 1e-6f;

  for (auto i = 0; i < 2; ++i)
  {
    // x >= 1e-6   ==>   1e-6 - x <= 0
    constraints[i] = parameter_min_value - parameters[i];
  }

  return constraints;
}